

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expr.h
# Opt level: O2

void __thiscall enact::SymbolExpr::~SymbolExpr(SymbolExpr *this)

{
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__SymbolExpr_001247b8;
  std::__cxx11::string::~string((string *)&(this->name).lexeme);
  return;
}

Assistant:

~SymbolExpr() override = default;